

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.cpp
# Opt level: O0

void __thiscall
duckdb::TableFunctionSet::TableFunctionSet(TableFunctionSet *this,TableFunction *fun)

{
  value_type *in_RSI;
  FunctionSet<duckdb::TableFunction> *in_RDI;
  string local_30 [48];
  
  ::std::__cxx11::string::string
            (local_30,(string *)
                      &(in_RSI->super_SimpleNamedParameterFunction).super_SimpleFunction.
                       super_Function.name);
  FunctionSet<duckdb::TableFunction>::FunctionSet(in_RDI,(string *)in_RSI);
  ::std::__cxx11::string::~string(local_30);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::push_back
            ((vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_> *)in_RDI,in_RSI)
  ;
  return;
}

Assistant:

TableFunctionSet::TableFunctionSet(TableFunction fun) : FunctionSet(std::move(fun.name)) {
	functions.push_back(std::move(fun));
}